

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateFlagInlineCacheCheckForGetterSetter
          (Lowerer *this,Instr *insertBeforeInstr,RegOpnd *opndInlineCache,LabelInstr *labelNext)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  JITTimeFunctionBody *pJVar4;
  FunctionJITTimeInfo *pFVar5;
  IndirOpnd *src1;
  IntConstOpnd *src2;
  long value;
  
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(insertBeforeInstr->m_func->m_workItem);
  uVar2 = JITTimeFunctionBody::GetSourceContextId(pJVar4);
  pFVar5 = JITTimeWorkItem::GetJITTimeInfo(insertBeforeInstr->m_func->m_workItem);
  uVar3 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar5);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,InlineGettersPhase,uVar2,uVar3);
  value = 4;
  if (!bVar1) {
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(insertBeforeInstr->m_func->m_workItem);
    uVar2 = JITTimeFunctionBody::GetSourceContextId(pJVar4);
    pFVar5 = JITTimeWorkItem::GetJITTimeInfo(insertBeforeInstr->m_func->m_workItem);
    uVar3 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar5);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,InlineSettersPhase,uVar2,uVar3);
    value = (ulong)!bVar1 * 4 + 2;
  }
  src1 = IR::IndirOpnd::New(opndInlineCache,8,TyInt8,insertBeforeInstr->m_func,false);
  src2 = IR::IntConstOpnd::New(value,TyInt8,this->m_func,false);
  InsertTest(&src1->super_Opnd,&src2->super_Opnd,insertBeforeInstr);
  InsertBranch(BrEq_A,false,labelNext,insertBeforeInstr);
  return;
}

Assistant:

void
Lowerer::GenerateFlagInlineCacheCheckForGetterSetter(
    IR::Instr * insertBeforeInstr,
    IR::RegOpnd * opndInlineCache,
    IR::LabelInstr * labelNext)
{
    uint accessorFlagMask;
    if (PHASE_OFF(Js::InlineGettersPhase, insertBeforeInstr->m_func))
    {
        accessorFlagMask = Js::InlineCache::GetSetterFlagMask();
    }
    else if (PHASE_OFF(Js::InlineSettersPhase, insertBeforeInstr->m_func))
    {
        accessorFlagMask = Js::InlineCache::GetGetterFlagMask();
    }
    else
    {
        accessorFlagMask = Js::InlineCache::GetGetterSetterFlagMask();
    }

    // Generate:
    //
    //      TEST [&(inlineCache->u.accessor.flags)], Js::InlineCacheGetterFlag | Js::InlineCacheSetterFlag
    //      JEQ $next

    IR::Opnd * flagsOpnd = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.accessor.rawUInt16), TyInt8, insertBeforeInstr->m_func);
    IR::Opnd * accessorOpnd = IR::IntConstOpnd::New(accessorFlagMask, TyInt8, this->m_func);
    InsertTestBranch(flagsOpnd, accessorOpnd, Js::OpCode::BrEq_A, labelNext, insertBeforeInstr);
}